

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

TRexBool trex_matchcclass(int cclass,char c)

{
  uint uVar1;
  ushort **ppuVar2;
  bool bVar3;
  
  uVar1 = 0;
  if (cclass < 99) {
    if (cclass < 0x50) {
      if (cclass == 0x41) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = (*(byte *)((long)*ppuVar2 + (long)c * 2 + 1) & 4) == 0;
      }
      else if (cclass == 0x43) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[c] & 2) == 0;
      }
      else {
        if (cclass != 0x44) {
          return 0;
        }
        ppuVar2 = __ctype_b_loc();
        bVar3 = (*(byte *)((long)*ppuVar2 + (long)c * 2 + 1) & 8) == 0;
      }
    }
    else {
      switch(cclass) {
      case 0x50:
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[c] & 4) == 0;
        break;
      case 0x51:
      case 0x52:
      case 0x54:
      case 0x55:
      case 0x56:
        goto switchD_0010feb5_caseD_51;
      case 0x53:
        ppuVar2 = __ctype_b_loc();
        bVar3 = (*(byte *)((long)*ppuVar2 + (long)c * 2 + 1) & 0x20) == 0;
        break;
      case 0x57:
        ppuVar2 = __ctype_b_loc();
        bVar3 = c != '_' && ((*ppuVar2)[c] & 8) == 0;
        goto LAB_0011003f;
      case 0x58:
        ppuVar2 = __ctype_b_loc();
        bVar3 = (*(byte *)((long)*ppuVar2 + (long)c * 2 + 1) & 0x10) == 0;
        break;
      default:
        if (cclass != 0x61) {
          return 0;
        }
        ppuVar2 = __ctype_b_loc();
        uVar1 = (uint)((*ppuVar2)[c] >> 10);
        goto LAB_00110082;
      }
    }
    uVar1 = (uint)bVar3;
  }
  else {
    switch(cclass) {
    case 0x6c:
      ppuVar2 = __ctype_b_loc();
      uVar1 = (uint)((*ppuVar2)[c] >> 9);
      break;
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
      goto switchD_0010feb5_caseD_51;
    case 0x70:
      ppuVar2 = __ctype_b_loc();
      uVar1 = (uint)((*ppuVar2)[c] >> 2);
      break;
    case 0x73:
      ppuVar2 = __ctype_b_loc();
      uVar1 = (uint)((*ppuVar2)[c] >> 0xd);
      break;
    case 0x75:
      ppuVar2 = __ctype_b_loc();
      uVar1 = (uint)((*ppuVar2)[c] >> 8);
      break;
    case 0x77:
      ppuVar2 = __ctype_b_loc();
      bVar3 = (bool)(c == '_' | ((byte)(*ppuVar2)[c] & 8) >> 3);
LAB_0011003f:
      return (uint)bVar3;
    case 0x78:
      ppuVar2 = __ctype_b_loc();
      uVar1 = (uint)((*ppuVar2)[c] >> 0xc);
      break;
    default:
      if (cclass == 99) {
        ppuVar2 = __ctype_b_loc();
        uVar1 = (uint)((*ppuVar2)[c] >> 1);
      }
      else {
        if (cclass != 100) {
          return 0;
        }
        ppuVar2 = __ctype_b_loc();
        uVar1 = (uint)((*ppuVar2)[c] >> 0xb);
      }
    }
LAB_00110082:
    uVar1 = uVar1 & 1;
  }
switchD_0010feb5_caseD_51:
  return uVar1;
}

Assistant:

static TRexBool trex_matchcclass(int cclass, TRexChar c) {
    switch (cclass) {
        case 'a':
            return isalpha(c) ? TRex_True : TRex_False;
        case 'A':
            return !isalpha(c) ? TRex_True : TRex_False;
        case 'w':
            return (isalnum(c) || c == '_') ? TRex_True : TRex_False;
        case 'W':
            return (!isalnum(c) && c != '_') ? TRex_True : TRex_False;
        case 's':
            return isspace(c) ? TRex_True : TRex_False;
        case 'S':
            return !isspace(c) ? TRex_True : TRex_False;
        case 'd':
            return isdigit(c) ? TRex_True : TRex_False;
        case 'D':
            return !isdigit(c) ? TRex_True : TRex_False;
        case 'x':
            return isxdigit(c) ? TRex_True : TRex_False;
        case 'X':
            return !isxdigit(c) ? TRex_True : TRex_False;
        case 'c':
            return iscntrl(c) ? TRex_True : TRex_False;
        case 'C':
            return !iscntrl(c) ? TRex_True : TRex_False;
        case 'p':
            return ispunct(c) ? TRex_True : TRex_False;
        case 'P':
            return !ispunct(c) ? TRex_True : TRex_False;
        case 'l':
            return islower(c) ? TRex_True : TRex_False;
        case 'u':
            return isupper(c) ? TRex_True : TRex_False;
    }
    return TRex_False; /*cannot happen*/
}